

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

Error __thiscall
asmjit::ZoneVectorBase::_reserve(ZoneVectorBase *this,ZoneHeap *heap,size_t sizeOfT,size_t n)

{
  bool bVar1;
  ZoneHeap *this_00;
  ulong uVar2;
  ulong in_RCX;
  ulong in_RDX;
  size_t *in_RSI;
  undefined8 *in_RDI;
  void *oldData;
  uint8_t *newData;
  size_t allocatedBytes;
  size_t nBytes;
  size_t oldCapacity;
  uint32_t slot;
  char *in_stack_00000320;
  int in_stack_0000032c;
  char *in_stack_00000330;
  size_t *__src;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  size_t *local_80;
  Error local_6c;
  ulong *local_60;
  ulong local_58;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  ZoneHeap *in_stack_ffffffffffffffc8;
  
  local_98 = in_RDI[2];
  if (local_98 < in_RCX) {
    local_a0 = in_RCX * in_RDX;
    if (local_a0 < in_RCX) {
      local_6c = 1;
    }
    else {
      local_60 = &local_a8;
      local_58 = local_a0;
      if (*in_RSI == 0) {
        DebugUtils::assertionFailed(in_stack_00000330,in_stack_0000032c,in_stack_00000320);
      }
      local_90 = in_RCX;
      local_88 = in_RDX;
      local_80 = in_RSI;
      this_00 = (ZoneHeap *)
                ZoneHeap::_alloc(in_stack_ffffffffffffffc8,
                                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                 in_RSI);
      if (this_00 == (ZoneHeap *)0x0) {
        local_6c = 1;
      }
      else {
        __src = (size_t *)*in_RDI;
        if (in_RDI[1] != 0) {
          memcpy(this_00,__src,in_RDI[1] * local_88);
        }
        if (__src != (size_t *)0x0) {
          uVar2 = local_98 * local_88;
          if (*local_80 == 0) {
            DebugUtils::assertionFailed(in_stack_00000330,in_stack_0000032c,in_stack_00000320);
          }
          if (__src == (size_t *)0x0) {
            DebugUtils::assertionFailed(in_stack_00000330,in_stack_0000032c,in_stack_00000320);
          }
          if (uVar2 == 0) {
            DebugUtils::assertionFailed(in_stack_00000330,in_stack_0000032c,in_stack_00000320);
          }
          if (uVar2 == 0) {
            DebugUtils::assertionFailed(in_stack_00000330,in_stack_0000032c,in_stack_00000320);
          }
          if (uVar2 < 0x201) {
            if (uVar2 < 0x81) {
              in_stack_ffffffffffffffc4 = (uint)(uVar2 - 1 >> 5);
            }
            else {
              in_stack_ffffffffffffffc4 = (int)(uVar2 - 0x81 >> 6) + 4;
            }
            bVar1 = true;
          }
          else {
            bVar1 = false;
          }
          if (bVar1) {
            *__src = local_80[(ulong)in_stack_ffffffffffffffc4 + 1];
            local_80[(ulong)in_stack_ffffffffffffffc4 + 1] = (size_t)__src;
          }
          else {
            ZoneHeap::_releaseDynamic(this_00,__src,(size_t)in_RDI);
          }
        }
        in_RDI[2] = local_a8 / local_88;
        if ((ulong)in_RDI[2] < local_90) {
          DebugUtils::assertionFailed(in_stack_00000330,in_stack_0000032c,in_stack_00000320);
        }
        *in_RDI = this_00;
        local_6c = 0;
      }
    }
  }
  else {
    local_6c = 0;
  }
  return local_6c;
}

Assistant:

Error ZoneVectorBase::_reserve(ZoneHeap* heap, size_t sizeOfT, size_t n) noexcept {
  size_t oldCapacity = _capacity;
  if (oldCapacity >= n) return kErrorOk;

  size_t nBytes = n * sizeOfT;
  if (ASMJIT_UNLIKELY(nBytes < n))
    return DebugUtils::errored(kErrorNoHeapMemory);

  size_t allocatedBytes;
  uint8_t* newData = static_cast<uint8_t*>(heap->alloc(nBytes, allocatedBytes));

  if (ASMJIT_UNLIKELY(!newData))
    return DebugUtils::errored(kErrorNoHeapMemory);

  void* oldData = _data;
  if (_length)
    ::memcpy(newData, oldData, _length * sizeOfT);

  if (oldData)
    heap->release(oldData, oldCapacity * sizeOfT);

  _capacity = allocatedBytes / sizeOfT;
  ASMJIT_ASSERT(_capacity >= n);

  _data = newData;
  return kErrorOk;
}